

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

shared_ptr<kratos::Var> __thiscall kratos::Var::cast(Var *this,VarCastType cast_type)

{
  element_type *peVar1;
  _Rb_tree_node_base *p_Var2;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_register_00000034;
  long lVar4;
  shared_ptr<kratos::Var> sVar5;
  long local_50;
  undefined1 local_48 [8];
  shared_ptr<kratos::VarCasted> v;
  VarCastType cast_type_local;
  
  lVar4 = CONCAT44(in_register_00000034,cast_type);
  if ((in_EDX == 0) && (*(char *)(lVar4 + 0xf0) == '\x01')) {
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(lVar4 + 0x68));
    _Var3._M_pi = extraout_RDX;
  }
  else {
    for (p_Var2 = *(_Rb_tree_node_base **)(lVar4 + 0x220);
        p_Var2 != (_Rb_tree_node_base *)(lVar4 + 0x210);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if ((in_EDX != 7) && (*(int *)(*(long *)(p_Var2 + 1) + 0x280) == in_EDX)) {
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::VarCasted,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 1));
        _Var3._M_pi = extraout_RDX_01;
        goto LAB_00172c03;
      }
    }
    local_50 = lVar4;
    std::make_shared<kratos::VarCasted,kratos::Var*,kratos::VarCastType&>
              ((Var **)local_48,(VarCastType *)&local_50);
    std::
    _Rb_tree<std::shared_ptr<kratos::VarCasted>,std::shared_ptr<kratos::VarCasted>,std::_Identity<std::shared_ptr<kratos::VarCasted>>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
    ::_M_emplace_unique<std::shared_ptr<kratos::VarCasted>&>
              ((_Rb_tree<std::shared_ptr<kratos::VarCasted>,std::shared_ptr<kratos::VarCasted>,std::_Identity<std::shared_ptr<kratos::VarCasted>>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
                *)(lVar4 + 0x208),(shared_ptr<kratos::VarCasted> *)local_48);
    peVar1 = v.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_IRNode)._vptr_IRNode = (_func_int **)local_48;
    v.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar1;
    local_48 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&v);
    _Var3._M_pi = extraout_RDX_00;
  }
LAB_00172c03:
  sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::Var>)sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Var> Var::cast(VarCastType cast_type) {
    if (cast_type == VarCastType::Signed && is_signed_) {
        return shared_from_this();
    } else {
        // optimize memory for speed
        for (auto const &casted : casted_) {
            if (casted->cast_type() == cast_type && cast_type != VarCastType::Resize) {
                return casted;
            }
        }
        auto v = std::make_shared<VarCasted>(this, cast_type);
        casted_.emplace(v);
        return v;
    }
}